

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::AddHeaderSetVerification(cmGlobalGenerator *this)

{
  bool bVar1;
  GeneratorTargetVector *pGVar2;
  size_type __n;
  reference ppcVar3;
  reference this_00;
  pointer this_01;
  cmLocalGenerator *pcVar4;
  reference pvVar5;
  pointer pcVar6;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_e8;
  allocator<char> local_d9;
  string local_d8;
  cmLocalGenerator *local_b8;
  cmTarget *allVerifyTarget;
  cmGeneratorTarget *local_a8;
  cmGeneratorTarget *tgt_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2_1;
  reference local_80;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *tgt;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  undefined1 local_50 [8];
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> genTargets;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *gen;
  iterator __end1;
  iterator __begin1;
  LocalGeneratorVector *__range1;
  cmGlobalGenerator *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(&this->LocalGenerators);
  gen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
        std::
        vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
        ::end(&this->LocalGenerators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                     *)&gen), bVar1) {
    genTargets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                  ::operator*(&__end1);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_50);
    pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                        genTargets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pGVar2 = cmLocalGenerator::GetGeneratorTargets(pcVar6);
    __n = std::
          vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
          ::size(pGVar2);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::reserve
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_50,__n);
    pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                        genTargets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pGVar2 = cmLocalGenerator::GetGeneratorTargets(pcVar6);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(pGVar2);
    tgt = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
          std::
          vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
          ::end(pGVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                       *)&tgt), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                 ::operator*(&__end2);
      __range2_1 = (vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                   std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (local_80);
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_50,
                 (value_type *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                         ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                          local_50);
    tgt_1 = (cmGeneratorTarget *)
            std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                      ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_50
                      );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                               *)&tgt_1), bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2_1);
      local_a8 = *ppcVar3;
      bVar1 = cmGeneratorTarget::AddHeaderSetVerification(local_a8);
      if (!bVar1) {
        this_local._7_1_ = 0;
        allVerifyTarget._4_4_ = 1;
        goto LAB_0051bd9a;
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2_1);
    }
    allVerifyTarget._4_4_ = 0;
LAB_0051bd9a:
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_50);
    if (allVerifyTarget._4_4_ != 0) goto LAB_0051bf41;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  this_00 = std::
            vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
            ::front(&this->Makefiles);
  this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"all_verify_interface_header_sets",&local_d9);
  pcVar4 = (cmLocalGenerator *)cmMakefile::FindTargetToUse(this_01,&local_d8,true);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  if (pcVar4 != (cmLocalGenerator *)0x0) {
    local_b8 = pcVar4;
    pvVar5 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::front(&this->LocalGenerators);
    pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (pvVar5);
    pvVar5 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::front(&this->LocalGenerators);
    std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get(pvVar5);
    std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*>
              ((cmTarget **)&local_e8,&local_b8);
    cmLocalGenerator::AddGeneratorTarget(pcVar6,&local_e8);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              (&local_e8);
  }
  this_local._7_1_ = 1;
LAB_0051bf41:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGenerator::AddHeaderSetVerification()
{
  for (auto const& gen : this->LocalGenerators) {
    // Because AddHeaderSetVerification() adds generator targets, we need to
    // cache the existing list of generator targets before starting.
    std::vector<cmGeneratorTarget*> genTargets;
    genTargets.reserve(gen->GetGeneratorTargets().size());
    for (auto const& tgt : gen->GetGeneratorTargets()) {
      genTargets.push_back(tgt.get());
    }

    for (auto* tgt : genTargets) {
      if (!tgt->AddHeaderSetVerification()) {
        return false;
      }
    }
  }

  cmTarget* allVerifyTarget = this->Makefiles.front()->FindTargetToUse(
    "all_verify_interface_header_sets", true);
  if (allVerifyTarget) {
    this->LocalGenerators.front()->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(allVerifyTarget,
                                         this->LocalGenerators.front().get()));
  }

  return true;
}